

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_fortify_weapon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  OBJ_APPLY_DATA **ppOVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  OBJ_APPLY_DATA *pOVar7;
  OBJ_APPLY_DATA *pOVar8;
  int iVar9;
  char *pcVar10;
  OBJ_APPLY_DATA **ppOVar11;
  char *local_48;
  
  if (*(short *)((long)vo + 0x98) != 5) {
    pcVar10 = "You can only cast this on weapons.\n\r";
LAB_00361a96:
    send_to_char(pcVar10,ch);
    return;
  }
  bVar3 = is_metal((OBJ_DATA *)vo);
  if (!bVar3) {
    pcVar10 = "You can only fortify metallic weapons.\n\r";
    goto LAB_00361a96;
  }
  bVar3 = is_worn((OBJ_DATA *)vo);
  if (bVar3) {
    pcVar10 = "You must remove it to enchant it.\n\r";
    goto LAB_00361a96;
  }
  iVar5 = ~*(uint *)((long)vo + 0x124) * *(int *)((long)vo + 0x120) + level;
  sVar4 = *(short *)(*(long *)((long)vo + 0x50) + 0xce);
  iVar6 = iVar5 * 4 + 0x32;
  if (sVar4 == 0) {
    iVar6 = iVar5 * 4 + 0x46;
  }
  iVar5 = iVar6 + -0x32;
  if (1 < (ushort)(sVar4 - 1U)) {
    iVar5 = iVar6;
  }
  if ((ushort)(sVar4 - 3U) < 0x12) {
    iVar5 = iVar6 - (int)((double)(int)sVar4 * -2.5 + 50.0);
  }
  iVar6 = number_percent();
  iVar5 = iVar5 - iVar6;
  if (iVar5 < 0x33) {
    if (iVar5 < 1) {
      if (iVar5 < -0x18) goto LAB_00361d62;
      act("Your magic fails to take hold on $p.",ch,vo,(void *)0x0,3);
      pcVar10 = "$p hums very briefly in $n\'s hands.";
      goto LAB_00361e05;
    }
    iVar6 = number_percent();
    if (iVar6 < 0x33) goto LAB_00361b47;
    pOVar7 = (OBJ_APPLY_DATA *)0x0;
    bVar3 = false;
    iVar6 = 0;
LAB_00361ba2:
    iVar9 = iVar6;
    ppOVar1 = (OBJ_APPLY_DATA **)((long)vo + 0x38);
    ppOVar11 = ppOVar1;
    while (pOVar8 = *ppOVar11, pOVar8 != (OBJ_APPLY_DATA *)0x0) {
      if ((pOVar8->location == 0x13) && (pOVar8->type == sn)) {
        iVar6 = (int)pOVar8->modifier;
        goto LAB_00361c3e;
      }
      ppOVar11 = &pOVar8->next;
    }
    pOVar8 = new_apply_data();
    pOVar8->type = (short)sn;
    pOVar8->location = 0x13;
    pOVar8->modifier = 0;
    pOVar8->next = *ppOVar1;
    *ppOVar1 = pOVar8;
    iVar6 = 0;
LAB_00361c3e:
    bVar2 = true;
  }
  else {
LAB_00361b47:
    ppOVar1 = (OBJ_APPLY_DATA **)((long)vo + 0x38);
    ppOVar11 = ppOVar1;
    while (pOVar7 = *ppOVar11, pOVar7 != (OBJ_APPLY_DATA *)0x0) {
      if ((pOVar7->location == 0x12) && (pOVar7->type == sn)) {
        iVar9 = (int)pOVar7->modifier;
        bVar3 = true;
        iVar6 = iVar9;
        if (iVar5 < 0x33) goto LAB_00361c02;
        goto LAB_00361ba2;
      }
      ppOVar11 = &pOVar7->next;
    }
    pOVar7 = new_apply_data();
    pOVar7->type = (short)sn;
    pOVar7->location = 0x12;
    pOVar7->modifier = 0;
    pOVar7->next = *ppOVar1;
    iVar9 = 0;
    *ppOVar1 = pOVar7;
    bVar3 = true;
    iVar6 = 0;
    if (0x32 < iVar5) goto LAB_00361ba2;
LAB_00361c02:
    bVar3 = true;
    bVar2 = false;
    pOVar8 = (OBJ_APPLY_DATA *)0x0;
    iVar6 = 0;
  }
  iVar5 = 0x50;
  if (!bVar3) {
    iVar5 = 0x32;
  }
  if (!bVar2) {
    iVar5 = 0x32;
  }
  iVar5 = (iVar5 - (int)((double)(iVar6 + iVar9) * 7.5)) +
          (level - *(int *)((long)vo + 0x120) * *(int *)((long)vo + 0x124)) * 4;
  if (10 < iVar9) {
    iVar5 = 2;
  }
  if (10 < iVar6) {
    iVar5 = 2;
  }
  if (bVar3) {
    iVar6 = number_percent();
    if (iVar6 < iVar5) {
      local_48 = "$p rings with a light piercing tone as $n\'s magic works upon it.";
      pcVar10 = "You feel $p\'s balance improve in your hands as it is infused with magic.";
      sVar4 = 1;
    }
    else {
      iVar6 = number_percent();
      if (iVar5 < iVar6) goto LAB_00361d62;
      local_48 = "$p emits a discordant tone as $n\'s magic works upon it.";
      pcVar10 = "You feel $p twist in your hands as the magic goes awry.";
      sVar4 = -1;
    }
    pOVar7->modifier = pOVar7->modifier + sVar4;
    act(pcVar10,ch,vo,(void *)0x0,3);
    act(local_48,ch,vo,(void *)0x0,0);
  }
  if (!bVar2) {
    return;
  }
  iVar6 = number_percent();
  if (iVar6 < iVar5) {
    pOVar8->modifier = pOVar8->modifier + 1;
    act("You feel $p grow sturdier in your hands as it is infused with magic.",ch,vo,(void *)0x0,3);
    pcVar10 = "$p flickers with a cerulean glow as $n\'s magic works upon it.";
  }
  else {
    iVar6 = number_percent();
    if (iVar5 < iVar6) {
LAB_00361d62:
      act("$p shudders and explodes in your hands!",ch,vo,(void *)0x0,3);
      act("$p shudders and explodes in $n\'s hands!",ch,vo,(void *)0x0,0);
      iVar6 = dice((int)*(short *)((long)vo + 0x108),5);
      damage_new(ch,ch,iVar6,-1,0xb,true,false,0,1,"the explosion*");
      extract_obj((OBJ_DATA *)vo);
      return;
    }
    pOVar8->modifier = pOVar8->modifier + -1;
    act("You feel $p grow frail in your hands as the magic goes awry.",ch,vo,(void *)0x0,3);
    pcVar10 = "$p flickers with a crimson glow as $n\'s magic works upon it.";
  }
LAB_00361e05:
  act(pcVar10,ch,vo,(void *)0x0,0);
  return;
}

Assistant:

void spell_fortify_weapon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *weapon = (OBJ_DATA *)vo;
	OBJ_APPLY_DATA *hitapp = nullptr, *damapp = nullptr;
	bool damfound = false, hitfound = false;
	bool dambonus = false, hitbonus = false;
	int chance = 50, diff, oldhit = 0, olddam = 0;

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You can only fortify metallic weapons.\n\r", ch);
		return;
	}

	if (is_worn(weapon))
	{
		send_to_char("You must remove it to enchant it.\n\r", ch);
		return;
	}

	chance += (4 * (level - ((1 + weapon->value[2]) * weapon->value[1])));

	if (weapon->pIndexData->limtotal == 0)
		chance += 20;

	if (weapon->pIndexData->limtotal == 1 || weapon->pIndexData->limtotal == 2)
		chance -= 50;

	if (weapon->pIndexData->limtotal >= 3 && weapon->pIndexData->limtotal <= 20)
		chance -= (int)(50 - (2.5 * (float)weapon->pIndexData->limtotal));

	diff = chance - number_percent();

	if (diff > 50)
	{
		hitbonus = true;
		dambonus = true;
	}
	else if (diff > 0)
	{
		if (number_percent() > 50)
			dambonus = true;
		else
			hitbonus = true;
	}
	else if (diff > -25)
	{
		act("Your magic fails to take hold on $p.", ch, weapon, 0, TO_CHAR);
		act("$p hums very briefly in $n's hands.", ch, weapon, 0, TO_ROOM);
		return;
	}
	else
	{
		act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
		act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
		damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
		extract_obj(weapon);
		return;
	}

	if (hitbonus)
	{
		for (hitapp = weapon->apply; hitapp; hitapp = hitapp->next)
		{
			if (hitapp->location == APPLY_HITROLL && hitapp->type == sn)
			{
				hitfound = true;
				oldhit = hitapp->modifier;
				break;
			}
		}

		if (!hitfound)
		{
			hitapp = new_apply_data();
			hitapp->type = sn;
			hitapp->location = APPLY_HITROLL;
			hitapp->modifier = 0;
			hitapp->next = weapon->apply;
			weapon->apply = hitapp;
		}
	}

	if (dambonus)
	{
		for (damapp = weapon->apply; damapp; damapp = damapp->next)
		{
			if (damapp->location == APPLY_DAMROLL && damapp->type == sn)
			{
				damfound = true;
				olddam = damapp->modifier;
				break;
			}
		}

		if (!damfound)
		{
			damapp = new_apply_data();
			damapp->type = sn;
			damapp->location = APPLY_DAMROLL;
			damapp->modifier = 0;
			damapp->next = weapon->apply;
			weapon->apply = damapp;
		}
	}

	chance = 50;
	chance -= (int)(7.5 * (olddam + oldhit));
	chance += 4 * (level - ((weapon->value[2]) * weapon->value[1]));

	if (hitbonus && dambonus)
		chance += 30;

	if (olddam > 10 || oldhit > 10)
		chance = 2;

	if (hitbonus)
	{
		if (number_percent() < chance)
		{
			hitapp->modifier += 1;
			act("You feel $p's balance improve in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p rings with a light piercing tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				hitapp->modifier -= 1;
				act("You feel $p twist in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p emits a discordant tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}

	if (dambonus)
	{
		if (number_percent() < chance)
		{
			damapp->modifier += 1;
			act("You feel $p grow sturdier in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p flickers with a cerulean glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				damapp->modifier -= 1;
				act("You feel $p grow frail in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p flickers with a crimson glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}
}